

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

string * __thiscall
Fixpp::Writer::
write<Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)48>,Fixpp::TagT<112u,Fixpp::Type::String>>>
          (string *__return_storage_ptr__,Writer *this,
          VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
          *header,VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>
                  *message)

{
  ostream *poVar1;
  runtime_error *this_00;
  long lVar2;
  undefined1 local_5a8 [8];
  StreamBuf<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>_>
  buf;
  ostream os;
  
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
  ::StreamBufBase((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                   *)local_5a8);
  std::ostream::ostream(&buf.off_,(streambuf *)local_5a8);
  if ((header->
      super_MessageT<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      ).
      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      .requiredBits.super__Base_bitset<1UL>._M_w == 0xf) {
    lVar2 = buf.super_SmallStreamBuf<1024UL,_char>._24_8_ -
            buf.super_SmallStreamBuf<1024UL,_char>._32_8_;
    writeRaw<Fixpp::TagT<35u,Fixpp::Type::String>>((ostream *)&buf.off_,"0",1);
    write<meta::tuple<Fixpp::Field<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<115u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<128u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<90u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<91u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<50u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<142u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<57u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<143u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<116u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<144u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<129u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<145u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<43u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<97u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<212u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<213u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<347u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<369u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul>
              (this,&buf.off_,header);
    doWriteField<Fixpp::Field<Fixpp::TagT<112u,Fixpp::Type::String>>>
              (this,(ostream *)&buf.off_,(Field<Fixpp::TagT<112U,_Fixpp::Type::String>_> *)message);
    StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
    ::prepareWriteHeader
              ((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                *)local_5a8,
               lVar2 + (buf.super_SmallStreamBuf<1024UL,_char>._32_8_ -
                       buf.super_SmallStreamBuf<1024UL,_char>._24_8_));
    writeTag<Fixpp::TagT<8u,Fixpp::Type::String>,char_const*const&>
              ((ostream *)&buf.off_,&v42::__VersionStaticHolder<Fixpp::v42::Version>::Str);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&buf.off_);
    poVar1 = std::operator<<(poVar1,"=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'|');
    buf.super_SmallStreamBuf<1024UL,_char>._32_8_ =
         (long)(int)(buf.super_SmallStreamBuf<1024UL,_char>._32_8_ -
                    buf.super_SmallStreamBuf<1024UL,_char>._24_8_) +
         buf.super_SmallStreamBuf<1024UL,_char>._24_8_;
    StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
    ::checksum((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                *)local_5a8);
    poVar1 = std::operator<<((ostream *)&buf.off_,"10=");
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)&buf.off_,'|');
    StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)48>,Fixpp::TagT<112u,Fixpp::Type::String>>,1024ul>
    ::asString_abi_cxx11_(__return_storage_ptr__,local_5a8);
    std::ios_base::~ios_base((ios_base *)&os);
    SmallStreamBuf<1024UL,_char>::~SmallStreamBuf((SmallStreamBuf<1024UL,_char> *)local_5a8);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Missing values for header");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string write(const Header& header, const Message& message)
    {
        StreamBuf<Message> buf;
        std::ostream os(&buf);

        if (!message.requiredBits.all())
        {
            std::ostringstream error;
            const size_t missingBits = message.requiredBits.size() - message.requiredBits.count();
            error << "Missing " << missingBits << " required value(s) for Message";
            throw std::runtime_error(error.str());
        }

        if (!header.requiredBits.all())
        {
            throw std::runtime_error("Missing values for header");
        }

        const auto startOffset = buf.offset();

        writeRaw<Tag::MsgType>(os, Message::MsgType::Value, Message::MsgType::Size);
        write(os, header.values, meta::seq::make_index_sequence<Header::TotalTags>());
        write(os, message.values, meta::seq::make_index_sequence<Message::TotalTags>());

        const auto endOffset = buf.offset();        

        const size_t size = endOffset - startOffset;

        auto context = buf.save();

        buf.prepareWriteHeader(size);

        writeTag<Tag::BeginString>(os, Message::Version::Str);
        os << Tag::BodyLength::Id << "=" << size << SOH;

        buf.restore(context);

        const size_t checksum = buf.checksum();
        os << "10=" << std::setfill('0') << std::setw(3) << checksum;

        os << SOH;

        return buf.asString();
    }